

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O2

TrapezoidList * __thiscall
gepard::TrapezoidTessellator::trapezoidList_abi_cxx11_
          (TrapezoidList *__return_storage_ptr__,TrapezoidTessellator *this,GepardState *state)

{
  _List_node_base *p_Var1;
  _List_node_base *__x;
  bool bVar2;
  TrapezoidTessellator *pTVar3;
  bool bVar4;
  _List_node_base *p_Var5;
  uint uVar6;
  uint uVar7;
  _List_node_base *p_Var8;
  iterator __end2;
  ArcElement *ae;
  ArcElement *arcElement;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  TrapezoidList trapezoids;
  FloatPoint to;
  FloatPoint lastMoveTo;
  FloatPoint from;
  SegmentApproximator segmentApproximator;
  Transform at;
  _List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> local_1e0;
  double dStack_1c8;
  double dStack_1c0;
  TrapezoidTessellator *local_1b0;
  undefined1 local_1a8 [16];
  FloatPoint local_198;
  value_type local_180;
  _List_node_base *local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  FloatPoint local_118;
  FloatPoint local_100;
  _List_node_base *local_f0;
  FloatPoint local_e8;
  FloatPoint local_d8;
  SegmentApproximator local_c8;
  Transform local_68;
  
  arcElement = (ArcElement *)this->_pathData->_firstElement;
  if ((arcElement == (ArcElement *)0x0) ||
     ((arcElement->super_PathElement).next == (PathElement *)0x0)) {
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node._M_size = 0;
  }
  else {
    local_1b0 = this;
    if ((arcElement->super_PathElement).type != MoveTo) {
      __assert_fail("element->type == PathElementTypes::MoveTo",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                    ,0x283,
                    "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                   );
    }
    local_f0 = (_List_node_base *)__return_storage_ptr__;
    SegmentApproximator::SegmentApproximator(&local_c8,this->_antiAliasingLevel,1.0);
    FloatPoint::FloatPoint(&local_e8);
    local_198.x = (arcElement->super_PathElement).to.x;
    local_198.y = (arcElement->super_PathElement).to.y;
    local_118.x = (arcElement->super_PathElement).to.x;
    local_118.y = (arcElement->super_PathElement).to.y;
    local_68.data[0] = (state->transform).data[0];
    local_68.data[1] = (state->transform).data[1];
    local_68.data[2] = (state->transform).data[2];
    local_68.data[3] = (state->transform).data[3];
    local_68.data[4] = (state->transform).data[4];
    local_68.data[5] = (state->transform).data[5];
    do {
      local_e8.x = local_198.x;
      local_e8.y = local_198.y;
      arcElement = (ArcElement *)(arcElement->super_PathElement).next;
      local_198.x = (arcElement->super_PathElement).to.x;
      local_198.y = (arcElement->super_PathElement).to.y;
      switch((arcElement->super_PathElement).type) {
      case MoveTo:
        local_180._0_16_ = Transform::apply(&local_68,&local_e8);
        local_1e0._M_impl._M_node.super__List_node_base =
             (_List_node_base)Transform::apply(&local_68,&local_118);
        SegmentApproximator::insertLine(&local_c8,(FloatPoint *)&local_180,(FloatPoint *)&local_1e0)
        ;
        goto LAB_00115f66;
      case LineTo:
        local_180._0_16_ = Transform::apply(&local_68,&local_e8);
        local_1e0._M_impl._M_node.super__List_node_base =
             (_List_node_base)Transform::apply(&local_68,&local_198);
        SegmentApproximator::insertLine(&local_c8,(FloatPoint *)&local_180,(FloatPoint *)&local_1e0)
        ;
        break;
      case QuadraticCurve:
        local_180._0_16_ = Transform::apply(&local_68,&local_e8);
        local_1e0._M_impl._M_node.super__List_node_base =
             (_List_node_base)Transform::apply(&local_68,&arcElement->center);
        local_100 = Transform::apply(&local_68,&local_198);
        SegmentApproximator::insertQuadCurve
                  (&local_c8,(FloatPoint *)&local_180,(FloatPoint *)&local_1e0,&local_100);
        break;
      case BezierCurve:
        local_180._0_16_ = Transform::apply(&local_68,&local_e8);
        local_1e0._M_impl._M_node.super__List_node_base =
             (_List_node_base)Transform::apply(&local_68,&arcElement->center);
        local_100 = Transform::apply(&local_68,&arcElement->radius);
        local_d8 = Transform::apply(&local_68,&local_198);
        SegmentApproximator::insertBezierCurve
                  (&local_c8,(FloatPoint *)&local_180,(FloatPoint *)&local_1e0,&local_100,&local_d8)
        ;
        break;
      case Arc:
        local_180._0_16_ = Transform::apply(&local_68,&local_e8);
        SegmentApproximator::insertArc(&local_c8,(FloatPoint *)&local_180,arcElement,&local_68);
        break;
      case CloseSubpath:
        local_180._0_16_ = Transform::apply(&local_68,&local_e8);
        local_1e0._M_impl._M_node.super__List_node_base =
             (_List_node_base)Transform::apply(&local_68,&local_118);
        SegmentApproximator::insertLine(&local_c8,(FloatPoint *)&local_180,(FloatPoint *)&local_1e0)
        ;
LAB_00115f66:
        local_118.x = local_198.x;
        local_118.y = local_198.y;
      }
    } while ((arcElement->super_PathElement).next != (PathElement *)0x0);
    local_180._0_16_ = Transform::apply(&local_68,&(arcElement->super_PathElement).to);
    local_1e0._M_impl._M_node.super__List_node_base =
         (_List_node_base)Transform::apply(&local_68,&local_118);
    pTVar3 = local_1b0;
    SegmentApproximator::insertLine(&local_c8,(FloatPoint *)&local_180,(FloatPoint *)&local_1e0);
    p_Var5 = (_List_node_base *)SegmentApproximator::segments_abi_cxx11_(&local_c8);
    local_1e0._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_1e0;
    local_1e0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1e0;
    local_1e0._M_impl._M_node._M_size = 0;
    local_128 = (double)pTVar3->_antiAliasingLevel;
    uVar7 = 0;
    p_Var8 = p_Var5;
    dStack_120 = local_128;
    bVar4 = false;
    local_1a8._0_8_ = local_128;
    while (p_Var8 = (((_List_impl *)&p_Var8->_M_next)->_M_node).super__List_node_base._M_next,
          p_Var8 != p_Var5) {
      p_Var1 = p_Var8[1]._M_prev;
      __x = p_Var8[2]._M_prev;
      if (((double)p_Var1 != (double)__x) || (NAN((double)p_Var1) || NAN((double)__x))) {
        uVar6 = uVar7 + *(int *)&p_Var8[4]._M_next;
        uVar7 = (uint)(uVar7 == 0);
        if (pTVar3->_fillRule != 0) {
          uVar7 = uVar6;
        }
        if (uVar7 == 0) {
          dVar9 = floor((double)p_Var8[1]._M_next * 1125899906842624.0);
          local_180.topRightX = (dVar9 * 8.881784197001252e-16) / (double)local_1a8._0_8_;
          dVar9 = floor((double)p_Var8[2]._M_next * 1125899906842624.0);
          local_180.bottomRightX = (dVar9 * 8.881784197001252e-16) / (double)local_1a8._0_8_;
          local_180.rightId = (uint)(long)(double)p_Var8[3]._M_next;
          local_180.rightSlope = (Float)p_Var8[3]._M_prev;
          uVar7 = 0;
          bVar4 = false;
          if ((local_180.topY != local_180.bottomY) ||
             (NAN(local_180.topY) || NAN(local_180.bottomY))) {
            uVar7 = 0;
            std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::push_back
                      ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&local_1e0,
                       &local_180);
            bVar4 = false;
          }
        }
        else {
          bVar2 = !bVar4;
          bVar4 = true;
          if (bVar2) {
            local_138 = p_Var1;
            dStack_1c8 = floor((double)__x);
            dVar9 = floor((double)local_138);
            auVar10._0_8_ = (double)(int)dVar9;
            auVar10._8_8_ = (double)(int)dStack_1c8;
            auVar11._8_8_ = dStack_120;
            auVar11._0_8_ = local_128;
            auVar11 = divpd(auVar10,auVar11);
            local_138 = (_List_node_base *)(auVar11._0_8_ * 1125899906842624.0);
            dStack_130 = auVar11._8_8_ * 1125899906842624.0;
            dStack_1c8 = floor((double)local_138);
            dStack_1c0 = floor(dStack_130);
            dStack_1c8 = dStack_1c8 * 8.881784197001252e-16;
            dStack_1c0 = dStack_1c0 * 8.881784197001252e-16;
            local_180.topY = dStack_1c8;
            local_180.bottomY = dStack_1c0;
            local_138 = (_List_node_base *)dStack_1c0;
            dStack_130 = dStack_1c0;
            dVar9 = floor((double)p_Var8[1]._M_next * 1125899906842624.0);
            local_180.topLeftX = (dVar9 * 8.881784197001252e-16) / (double)local_1a8._0_8_;
            dVar9 = floor((double)p_Var8[2]._M_next * 1125899906842624.0);
            local_180.bottomLeftX = (dVar9 * 8.881784197001252e-16) / (double)local_1a8._0_8_;
            local_180.leftId = (uint)(long)(double)p_Var8[3]._M_next;
            local_180.leftSlope = (Float)p_Var8[3]._M_prev;
            bVar4 = false;
            if ((dStack_1c8 != (double)local_138) || (NAN(dStack_1c8) || NAN((double)local_138))) {
              bVar4 = true;
            }
          }
        }
      }
    }
    std::__cxx11::_List_base<gepard::Segment,_std::allocator<gepard::Segment>_>::_M_clear
              ((_List_base<gepard::Segment,_std::allocator<gepard::Segment>_> *)p_Var5);
    operator_delete(p_Var5);
    local_1a8._8_8_ = extraout_XMM0_Qb;
    local_1a8._0_8_ = (double)pTVar3->_antiAliasingLevel;
    dStack_1c8 = local_c8._boundingBox.minX * 1125899906842624.0;
    dStack_1c0 = local_c8._boundingBox.minY * 1125899906842624.0;
    local_128 = floor(dStack_1c8);
    dVar9 = floor(dStack_1c0);
    auVar12._0_8_ = local_128 * 8.881784197001252e-16;
    auVar12._8_8_ = dVar9 * 8.881784197001252e-16;
    local_1a8._8_8_ = local_1a8._0_8_;
    auVar11 = divpd(auVar12,local_1a8);
    (pTVar3->_boundingBox).minX = (Float)auVar11._0_8_;
    (pTVar3->_boundingBox).minY = (Float)auVar11._8_8_;
    dStack_1c8 = local_c8._boundingBox.maxX * 1125899906842624.0;
    dStack_1c0 = local_c8._boundingBox.maxY * 1125899906842624.0;
    local_128 = floor(dStack_1c8);
    dVar9 = floor(dStack_1c0);
    auVar13._0_8_ = local_128 * 8.881784197001252e-16;
    auVar13._8_8_ = dVar9 * 8.881784197001252e-16;
    auVar11 = divpd(auVar13,local_1a8);
    (pTVar3->_boundingBox).maxX = (Float)auVar11._0_8_;
    (pTVar3->_boundingBox).maxY = (Float)auVar11._8_8_;
    std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::sort
              ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&local_1e0);
    __return_storage_ptr__ = (TrapezoidList *)local_f0;
    local_f0->_M_prev = local_f0;
    local_f0->_M_next = local_f0;
    local_f0[1]._M_next = (_List_node_base *)0x0;
    p_Var8 = (_List_node_base *)&local_1e0;
LAB_00116359:
    p_Var8 = (((_List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&p_Var8->_M_next
              )->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var8 != (_List_node_base *)&local_1e0) {
      if ((*(int *)&p_Var8[4]._M_next == 0) || (*(int *)((long)&p_Var8[4]._M_next + 4) == 0)) {
        __assert_fail("current->leftId != 0 && current->rightId != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                      ,0x2fa,
                      "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                     );
      }
      local_1b0 = (TrapezoidTessellator *)p_Var8[2]._M_prev;
      for (p_Var5 = p_Var8;
          (p_Var5 != (_List_node_base *)&local_1e0 &&
          (dVar9 = (double)p_Var5[1]._M_next, dVar9 <= (double)local_1b0)); p_Var5 = p_Var5->_M_next
          ) {
        if ((*(int *)&p_Var5[4]._M_next == 0) || (*(int *)((long)&p_Var5[4]._M_next + 4) == 0)) {
          __assert_fail("further->leftId != 0 && further->rightId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                        ,0x2fd,
                        "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                       );
        }
        if (((dVar9 == (double)p_Var8[2]._M_prev) &&
            (!NAN(dVar9) && !NAN((double)p_Var8[2]._M_prev))) &&
           (bVar4 = Trapezoid::isMergableInTo((Trapezoid *)(p_Var8 + 1),(Trapezoid *)(p_Var5 + 1)),
           bVar4)) {
          p_Var1 = p_Var8[1]._M_prev;
          p_Var5[1]._M_next = p_Var8[1]._M_next;
          p_Var5[1]._M_prev = p_Var1;
          p_Var5[2]._M_next = p_Var8[2]._M_next;
          p_Var8[4]._M_next = (_List_node_base *)0x0;
          goto LAB_00116359;
        }
      }
      if (*(int *)&p_Var8[4]._M_next != 0) {
        std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::push_back
                  (__return_storage_ptr__,(Trapezoid *)(p_Var8 + 1));
      }
      goto LAB_00116359;
    }
    std::__cxx11::_List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::_M_clear
              (&local_1e0);
    SegmentApproximator::~SegmentApproximator(&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

const TrapezoidList TrapezoidTessellator::trapezoidList(const GepardState& state)
{
    PathElement* element = _pathData.firstElement();

    if (!element || !element->next)
        return TrapezoidList();

    GD_ASSERT(element->type == PathElementTypes::MoveTo);

    const Float subPixelPrecision = 1.0;
    SegmentApproximator segmentApproximator(_antiAliasingLevel, subPixelPrecision);
    FloatPoint from;
    FloatPoint to = element->to;
    FloatPoint lastMoveTo = to;
    Transform at = state.transform;

    // 1. Insert path elements.
    do {
        from = to;
        element = element->next;
        to = element->to;
        switch (element->type) {
        case PathElementTypes::MoveTo: {
            segmentApproximator.insertLine(at.apply(from), at.apply(lastMoveTo));
            lastMoveTo = to;
            break;
        }
        case PathElementTypes::LineTo: {
            segmentApproximator.insertLine(at.apply(from), at.apply(to));
            break;
        }
        case PathElementTypes::CloseSubpath: {
            segmentApproximator.insertLine(at.apply(from), at.apply(lastMoveTo));
            lastMoveTo = to;
            break;
        }
        case PathElementTypes::QuadraticCurve: {
            QuadraticCurveToElement* qe = reinterpret_cast<QuadraticCurveToElement*>(element);
            segmentApproximator.insertQuadCurve(at.apply(from), at.apply(qe->control), at.apply(to));
            break;
        }
        case PathElementTypes::BezierCurve: {
            BezierCurveToElement* be = reinterpret_cast<BezierCurveToElement*>(element);
            segmentApproximator.insertBezierCurve(at.apply(from), at.apply(be->control1), at.apply(be->control2), at.apply(to));
            break;
        }
        case PathElementTypes::Arc: {
            ArcElement* ae = reinterpret_cast<ArcElement*>(element);
            segmentApproximator.insertArc(at.apply(from), ae, at);
            break;
        }
        case PathElementTypes::Undefined:
        default:
            // unreachable
            break;
        }
    } while (element->next != nullptr);

    segmentApproximator.insertLine(at.apply(element->to), at.apply(lastMoveTo));

    // 2. Use approximator to generate the list of segments.
    SegmentList* segmentList = segmentApproximator.segments();
    TrapezoidList trapezoids;

    // 3. Generate trapezoids.
    const Float denom = _antiAliasingLevel * 1 + 0;
    if (segmentList) {
        Trapezoid trapezoid;
        int fill = 0;
        bool isInFill = false;
        for (Segment& segment : *segmentList) {
            if (segment.from.y == segment.to.y)
                continue;
            if (fillRule() == EvenOdd) {
                fill = !fill;
            } else {
                fill += segment.direction;
            }

            if (fill) {
                if (!isInFill) {
                    trapezoid.topY = (fixPrecision(segment.topY() / denom));
                    trapezoid.bottomY = (fixPrecision(segment.bottomY() / denom));
                    trapezoid.topLeftX = (fixPrecision(segment.from.x) / denom);
                    trapezoid.bottomLeftX = (fixPrecision(segment.to.x) / denom);
                    trapezoid.leftId = segment.id;
                    trapezoid.leftSlope = segment.realSlope;
                    if (trapezoid.topY != trapezoid.bottomY)
                        isInFill = true;
                }
            } else {
                // TODO: Horizontal merge trapezoids.
                trapezoid.topRightX = (fixPrecision(segment.from.x) / denom);
                trapezoid.bottomRightX = (fixPrecision(segment.to.x) / denom);
                trapezoid.rightId = segment.id;
                trapezoid.rightSlope = segment.realSlope;
                if (trapezoid.topY != trapezoid.bottomY) {
                    trapezoids.push_back(trapezoid);
                }
                isInFill = false;
            }
            //! \todo(szledan): we need this assert in the future,
            //! but the TT doesn't work correctly now with that.
            // GD_ASSERT(trapezoid.topY == (fixPrecision(segment.topY() / denom)));
        }

        delete segmentList;

        //! \todo(szledan): check the boundingBox calculation:
        // NOTE:  maxX = (maxX + (_antiAliasingLevel - 1)) / _antiAliasingLevel;
        _boundingBox.minX = (fixPrecision(segmentApproximator.boundingBox().minX) / _antiAliasingLevel);
        _boundingBox.minY = (fixPrecision(segmentApproximator.boundingBox().minY) / _antiAliasingLevel);
        _boundingBox.maxX = (fixPrecision(segmentApproximator.boundingBox().maxX) / _antiAliasingLevel);
        _boundingBox.maxY = (fixPrecision(segmentApproximator.boundingBox().maxY) / _antiAliasingLevel);
    }

    trapezoids.sort();

    // 4. Vertical merge trapezoids.
    //! \todo(szledan): use MovePtr:
    TrapezoidList trapezoidList;
    for (TrapezoidList::iterator current = trapezoids.begin(); current != trapezoids.end(); ++current) {
        const Float bottomY = current->bottomY;
        TrapezoidList::iterator ft = current;
        for (; (ft != trapezoids.end() && ft->bottomY == bottomY); ++ft);

        GD_ASSERT(current->leftId != 0 && current->rightId != 0);
        GD_ASSERT(current->leftSlope != NAN && current->rightSlope != NAN);
        for (TrapezoidList::iterator further = current; (further != trapezoids.end() && further->topY <= bottomY); ++further) {
            GD_ASSERT(further->leftId != 0 && further->rightId != 0);
            GD_ASSERT(further->leftSlope != NAN && further->rightSlope != NAN);
            if (further->topY == current->bottomY && current->isMergableInTo(&*further)) {
                further->topY = current->topY;
                further->topLeftX = current->topLeftX;
                further->topRightX = current->topRightX;
                current->leftId = 0;
                current->rightId = 0;
                break;
            }
        }
        if (current->leftId) {
            trapezoidList.push_back(*current);
        }
    }

    return trapezoidList;
}